

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O3

float Map_MappingGetAreaFlow(Map_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  Map_Node_t *p_00;
  long lVar4;
  float local_1c;
  
  if (p->nOutputs < 1) {
    local_1c = 0.0;
  }
  else {
    local_1c = 0.0;
    lVar4 = 0;
    do {
      p_00 = (Map_Node_t *)((ulong)p->pOutputs[lVar4] & 0xfffffffffffffffe);
      iVar1 = Map_NodeIsAnd(p_00);
      if (iVar1 != 0) {
        uVar2 = (ulong)((uint)p->pOutputs[lVar4] & 1);
        uVar3 = uVar2 ^ 1;
        if (p_00->pCutBest[uVar3] != (Map_Cut_t *)0x0) {
          uVar2 = uVar3;
        }
        local_1c = local_1c + p_00->pCutBest[uVar2]->M[uVar2].AreaFlow;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->nOutputs);
  }
  return local_1c;
}

Assistant:

float Map_MappingGetAreaFlow( Map_Man_t * p )
{
    Map_Node_t * pNode;
    Map_Cut_t * pCut;
    float aFlowFlowTotal = 0;
    int fPosPol, i;
    for ( i = 0; i < p->nOutputs; i++ )
    {
        pNode = Map_Regular(p->pOutputs[i]);
        if ( !Map_NodeIsAnd(pNode) )
            continue;
        fPosPol = !Map_IsComplement(p->pOutputs[i]);
        pCut = pNode->pCutBest[fPosPol];
        if ( pCut == NULL )
        {
            fPosPol = !fPosPol;
            pCut = pNode->pCutBest[fPosPol];
        }
        aFlowFlowTotal += pNode->pCutBest[fPosPol]->M[fPosPol].AreaFlow;
    }
    return aFlowFlowTotal;
}